

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knn_graph.h
# Opt level: O0

void __thiscall
gnns::Knn_Graph<L2Distance<float>_>::nth_index_element
          (Knn_Graph<L2Distance<float>_> *this,DistanceType *dist,size_t_conflict length,
          DistanceType *elements,IndexType *indices,size_t_conflict n)

{
  reference pvVar1;
  uint local_bc;
  iterator iStack_b8;
  size_t_conflict i_1;
  __normal_iterator<std::pair<float,_unsigned_int>_*,_std::vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>_>
  local_b0;
  pair<float,_unsigned_int> *local_a8;
  __normal_iterator<std::pair<float,_unsigned_int>_*,_std::vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>_>
  local_a0;
  pair<float,_unsigned_int> *local_98;
  __normal_iterator<std::pair<float,_unsigned_int>_*,_std::vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>_>
  local_90;
  __normal_iterator<std::pair<float,_unsigned_int>_*,_std::vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>_>
  local_88;
  __normal_iterator<std::pair<float,_unsigned_int>_*,_std::vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>_>
  local_80;
  __normal_iterator<std::pair<float,_unsigned_int>_*,_std::vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>_>
  local_78;
  pair<float,_unsigned_int> local_5c;
  uint local_54;
  undefined1 local_50 [4];
  int i;
  vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_> v;
  size_t_conflict n_local;
  IndexType *indices_local;
  DistanceType *elements_local;
  size_t_conflict length_local;
  DistanceType *dist_local;
  Knn_Graph<L2Distance<float>_> *this_local;
  
  v.
  super__Vector_base<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = n;
  std::vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>::
  vector((vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_> *
         )local_50);
  for (local_54 = 0; local_54 < length; local_54 = local_54 + 1) {
    std::pair<float,_unsigned_int>::pair<float_&,_int_&,_true>
              (&local_5c,dist + (int)local_54,(int *)&local_54);
    std::vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>::
    push_back((vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>
               *)local_50,&local_5c);
  }
  local_78._M_current =
       (pair<float,_unsigned_int> *)
       std::vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>
       ::begin((vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>
                *)local_50);
  local_90._M_current =
       (pair<float,_unsigned_int> *)
       std::vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>
       ::begin((vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>
                *)local_50);
  local_88 = __gnu_cxx::
             __normal_iterator<std::pair<float,_unsigned_int>_*,_std::vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>_>
             ::operator+(&local_90,
                         (ulong)v.
                                super__Vector_base<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  local_80 = __gnu_cxx::
             __normal_iterator<std::pair<float,_unsigned_int>_*,_std::vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>_>
             ::operator+(&local_88,1);
  local_98 = (pair<float,_unsigned_int> *)
             std::
             vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>
             ::end((vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>
                    *)local_50);
  std::
  nth_element<__gnu_cxx::__normal_iterator<std::pair<float,unsigned_int>*,std::vector<std::pair<float,unsigned_int>,std::allocator<std::pair<float,unsigned_int>>>>>
            (local_78,local_80,
             (__normal_iterator<std::pair<float,_unsigned_int>_*,_std::vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>_>
              )local_98);
  local_a0._M_current =
       (pair<float,_unsigned_int> *)
       std::vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>
       ::begin((vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>
                *)local_50);
  iStack_b8 = std::
              vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>
              ::begin((vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>
                       *)local_50);
  local_b0 = __gnu_cxx::
             __normal_iterator<std::pair<float,_unsigned_int>_*,_std::vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>_>
             ::operator+(&stack0xffffffffffffff48,
                         (ulong)v.
                                super__Vector_base<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  local_a8 = (pair<float,_unsigned_int> *)
             __gnu_cxx::
             __normal_iterator<std::pair<float,_unsigned_int>_*,_std::vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>_>
             ::operator+(&local_b0,1);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<float,unsigned_int>*,std::vector<std::pair<float,unsigned_int>,std::allocator<std::pair<float,unsigned_int>>>>>
            (local_a0,(__normal_iterator<std::pair<float,_unsigned_int>_*,_std::vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>_>
                       )local_a8);
  for (local_bc = 0;
      local_bc <
      v.
      super__Vector_base<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; local_bc = local_bc + 1) {
    pvVar1 = std::
             vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>
             ::operator[]((vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>
                           *)local_50,(ulong)(local_bc + 1));
    elements[local_bc] = pvVar1->first;
    pvVar1 = std::
             vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>
             ::operator[]((vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>
                           *)local_50,(ulong)(local_bc + 1));
    indices[local_bc] = pvVar1->second;
  }
  std::vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>::
  ~vector((vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>
           *)local_50);
  return;
}

Assistant:

void nth_index_element(DistanceType* dist, const size_t length, DistanceType* elements, IndexType* indices, const size_t n)
        {
            //construct a vector with index
            std::vector<std::pair<DistanceType, IndexType>> v;
            for(int i=0;i<length;++i)
                v.push_back(std::pair<DistanceType, size_t>(dist[i], i));

            //since it contain the point itself and find n+1 minimum elements
            std::nth_element(v.begin(), v.begin()+n+1, v.end());
            std::sort(v.begin(), v.begin()+n+1);
            //eliminate the first element(itself)
            for(size_t i=0;i<n;++i)
            {
                elements[i] = v[i+1].first;
                indices[i] = v[i+1].second;
            }
        }